

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O3

time_point __thiscall absl::ToChronoTime(absl *this,Time t)

{
  time_point tVar1;
  Duration DVar2;
  Duration num;
  Duration DStack_10;
  
  DVar2._8_8_ = t.rep_.rep_hi_;
  if (this == (absl *)0x0) {
    this = (absl *)0x0;
  }
  else if ((long)this < 0) {
    DStack_10.rep_hi_ = 0x1554ed;
    DVar2.rep_hi_ = (int64_t)this;
    DVar2 = Floor(DVar2,(Duration)(ZEXT816(4) << 0x40));
    this = (absl *)DVar2.rep_hi_;
    DVar2._8_8_ = (ulong)DVar2.rep_lo_;
  }
  if ((uint)DVar2._8_8_ == 0xffffffff) {
    tVar1.__d.__r = (duration)-0x8000000000000000;
    if (-1 < (long)this) {
      tVar1.__d.__r = (duration)0x7fffffffffffffff;
    }
    return (time_point)tVar1.__d.__r;
  }
  if ((ulong)this >> 0x21 == 0) {
    return (time_point)((ulong)((uint)DVar2._8_8_ >> 2) + (long)this * 1000000000);
  }
  num._8_8_ = DVar2._8_8_ & 0xffffffff;
  num.rep_hi_ = (int64_t)this;
  tVar1.__d.__r =
       (duration)time_internal::IDivDuration(true,num,(Duration)(ZEXT816(4) << 0x40),&DStack_10);
  return (time_point)tVar1.__d.__r;
}

Assistant:

constexpr bool operator<(Duration lhs, Duration rhs) {
  return time_internal::GetRepHi(lhs) != time_internal::GetRepHi(rhs)
             ? time_internal::GetRepHi(lhs) < time_internal::GetRepHi(rhs)
         : time_internal::GetRepHi(lhs) == (std::numeric_limits<int64_t>::min)()
             ? time_internal::GetRepLo(lhs) + 1 <
                   time_internal::GetRepLo(rhs) + 1
             : time_internal::GetRepLo(lhs) < time_internal::GetRepLo(rhs);
}